

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O3

void olsrv2_routing_initiate_shutdown(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  long lVar3;
  
  _initiate_shutdown = 1;
  _freeze_routes = false;
  lVar3 = 0;
  do {
    plVar2 = _routing_tree[lVar3].list_head.next;
    if (plVar2->prev != _routing_tree[lVar3].list_head.prev) {
      do {
        plVar1 = plVar2->next;
        plVar2[-0xd].prev = (list_entity *)0x0;
        os_routing_linux_interrupt((os_route *)&plVar2[-0x17].prev);
        plVar2[-0xd].prev = (list_entity *)_cb_route_finished;
        if (*(char *)((long)&plVar2[-8].prev + 3) == '\x01') {
          *(undefined1 *)((long)&plVar2[-8].prev + 3) = 0;
          _add_route_to_kernel_queue((olsrv2_routing_entry *)&plVar2[-0x17].prev);
        }
        plVar2 = plVar1;
      } while (plVar1->prev != _routing_tree[lVar3].list_head.prev);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  _process_kernel_queue();
  return;
}

Assistant:

void
olsrv2_routing_initiate_shutdown(void) {
  struct olsrv2_routing_entry *entry, *e_it;
  int i;

  /* remember we are in shutdown */
  _initiate_shutdown = true;
  _freeze_routes = false;

  /* remove all routes */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_for_each_element_safe(&_routing_tree[i], entry, _node, e_it) {
      /* stop internal route processing */
      entry->route.cb_finished = NULL;
      os_routing_interrupt(&entry->route);
      entry->route.cb_finished = _cb_route_finished;

      if (entry->set) {
        entry->set = false;
        _add_route_to_kernel_queue(entry);
      }
    }
  }

  _process_kernel_queue();
}